

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

string * __thiscall
HPresolve::getDualsForcingRow_abi_cxx11_
          (string *__return_storage_ptr__,HPresolve *this,int row,
          vector<int,_std::allocator<int>_> *fRjs)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  double dVar1;
  int iVar2;
  pointer piVar3;
  ostream *poVar4;
  reference pvVar5;
  reference pvVar6;
  ulong uVar7;
  _Elt_pointer ppVar8;
  size_type __n;
  size_type __n_00;
  double dVar9;
  double local_258;
  double up;
  double lo;
  KktChStep *local_218;
  vector<double,_std::allocator<double>_> *local_210;
  vector<int,_std::allocator<int>_> *local_208;
  ulong local_200;
  vector<double,_std::allocator<double>_> *local_1f8;
  vector<double,_std::allocator<double>_> v;
  pair<int,_std::vector<double,_std::allocator<double>_>_> p;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  lo = -1e+200;
  up = 1e+200;
  for (uVar7 = 0; dVar1 = lo, dVar9 = up,
      piVar3 = (fRjs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start,
      uVar7 < (ulong)((long)(fRjs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar3 >> 2);
      uVar7 = uVar7 + 1) {
    ppVar8 = (this->super_HPreData).oldBounds.c.
             super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVar8 == *(_Elt_pointer *)
                   ((long)&(this->super_HPreData).oldBounds.c.
                           super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish + 8)) {
      ppVar8 = (*(_Map_pointer *)
                 ((long)&(this->super_HPreData).oldBounds.c.
                         super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish + 0x18))[-1] + 0x10;
    }
    iVar2 = piVar3[uVar7];
    std::pair<int,_std::vector<double,_std::allocator<double>_>_>::pair(&p,ppVar8 + -1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               &v.super__Vector_base<double,_std::allocator<double>_>,&p.second);
    std::
    deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
    ::pop_back(&(this->super_HPreData).oldBounds.c);
    getBoundOnLByZj(this,row,iVar2,&lo,&up,
                    *v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                    v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[1]);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&v.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&p.second.super__Vector_base<double,_std::allocator<double>_>);
  }
  if (up < lo) {
    poVar4 = std::operator<<((ostream *)&std::cout,"PR: Error in postsolving forcing row ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,row);
    std::operator<<(poVar4," : inconsistent bounds for it\'s dual value.\n");
  }
  if ((0.0 < dVar1) || (dVar9 < 0.0)) {
    if (dVar1 <= 0.0) {
      if (0.0 <= dVar9) goto LAB_00147d3e;
      pvVar5 = std::vector<double,_std::allocator<double>_>::at
                         (&(this->super_HPreData).valueRowDual,(long)row);
    }
    else {
      pvVar5 = std::vector<double,_std::allocator<double>_>::at
                         (&(this->super_HPreData).valueRowDual,(long)row);
      dVar9 = dVar1;
    }
    *pvVar5 = dVar9;
  }
  else {
    pvVar5 = std::vector<double,_std::allocator<double>_>::at
                       (&(this->super_HPreData).valueRowDual,(long)row);
    *pvVar5 = 0.0;
  }
LAB_00147d3e:
  this_01 = &(this->super_HPreData).flagRow;
  pvVar6 = std::vector<int,_std::allocator<int>_>::at(this_01,(long)row);
  *pvVar6 = 1;
  this_02 = &(this->super_HPreData).valueColDual;
  local_208 = &(this->super_HPreData).Astart;
  this_00 = &(this->super_HPreData).Aindex;
  local_1f8 = &(this->super_HPreData).valueRowDual;
  local_218 = &(this->super_HPreData).chk;
  local_210 = &(this->super_HPreData).valuePrimal;
  uVar7 = 0;
  while (piVar3 = (fRjs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        uVar7 < (ulong)((long)(fRjs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar3 >> 2)) {
    iVar2 = piVar3[uVar7];
    __n = (size_type)iVar2;
    local_200 = uVar7;
    pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n);
    dVar9 = *pvVar5;
    pvVar6 = std::vector<int,_std::allocator<int>_>::at(local_208,__n);
    local_258 = 0.0;
    for (__n_00 = (size_type)*pvVar6;
        pvVar6 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).Aend,__n),
        (long)__n_00 < (long)*pvVar6; __n_00 = __n_00 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::at(this_00,__n_00);
      pvVar6 = std::vector<int,_std::allocator<int>_>::at(this_01,(long)*pvVar6);
      if (*pvVar6 != 0) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::at(this_00,__n_00);
        pvVar5 = std::vector<double,_std::allocator<double>_>::at(local_1f8,(long)*pvVar6);
        dVar1 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::at
                           (&(this->super_HPreData).Avalue,__n_00);
        local_258 = local_258 + dVar1 * *pvVar5;
      }
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n);
    *pvVar5 = local_258 + dVar9;
    if (this->iKKTcheck == 1) {
      std::ostream::operator<<(local_1a8,iVar2);
      std::operator<<(local_1a8," ");
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(local_210,__n);
      dVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_02,__n);
      KktChStep::addChange(local_218,2,0,iVar2,dVar1,*pvVar5,dVar9);
    }
    uVar7 = local_200 + 1;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

string HPresolve::getDualsForcingRow( int row, vector<int>& fRjs) {
	double z;
	stringstream ss;
	int j;

	double lo = -HSOL_CONST_INF;
	double up = HSOL_CONST_INF;

	double cost, sum;

	for (size_t jj=0;jj<fRjs.size();++jj) {
			j = fRjs[jj];

			pair<int, vector<double> > p = oldBounds.top();
			vector<double> v = get<1>(p);
			oldBounds.pop();
			double colLow = v[0];
			double colUpp = v[1];


			//calculate bound x imposed by zj
			getBoundOnLByZj(row, j, &lo, &up, colLow, colUpp);
		}

	//calculate yi
	if (lo>up)
		cout<<"PR: Error in postsolving forcing row "<<row <<" : inconsistent bounds for it's dual value.\n";

	if (lo<=0 && up>=0) {
		valueRowDual.at(row) = 0;
	}
	else if (lo>0) {
		valueRowDual.at(row) = lo;
	}
	else if (up<0) {
		valueRowDual.at(row) = up;
	}

	flagRow.at(row) = 1;


	for (size_t jj=0;jj<fRjs.size();++jj) {
			j = fRjs[jj];
			cost = valueColDual.at(j);
			sum = 0;
			for (int k=Astart.at(j); k<Aend.at(j);++k )
				if (flagRow.at(Aindex.at(k))) {
					sum = sum + valueRowDual.at(Aindex.at(k))*Avalue.at(k);
					//cout<<" row "<<Aindex.at(k)<<" dual "<<valueRowDual.at(Aindex.at(k))<<" a_"<<Aindex.at(k)<<"_"<<j<<"\n";
				}
			z = cost + sum;

			valueColDual.at(j) = z;

			if (iKKTcheck == 1) {
				ss<<j;
				ss<<" ";
				chk.addChange(2, 0, j, valuePrimal.at(j), valueColDual.at(j), cost);
			}
		}

	return ss.str();
}